

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall
google::protobuf::FieldOptions::MergePartialFromCodedStream
          (FieldOptions *this,CodedInputStream *input)

{
  Message *containing_type;
  CodedInputStream *pCVar1;
  bool bVar2;
  uint32 uVar3;
  int iVar4;
  WireType WVar5;
  string *value_00;
  char *data;
  UninterpretedOption *value_01;
  UnknownFieldSet *pUVar6;
  FieldOptions_CType local_120;
  uint32 local_11c;
  int value;
  uint32 tag;
  CodedInputStream *input_local;
  FieldOptions *this_local;
  CodedInputStream *local_100;
  uint32 local_f8;
  uint local_f4;
  CodedInputStream *local_f0;
  char local_e5;
  uint local_e4;
  CodedInputStream *local_e0;
  char local_d5;
  undefined4 local_d4;
  CodedInputStream *local_d0;
  char local_c5;
  undefined4 local_c4;
  CodedInputStream *local_c0;
  char local_b5;
  undefined4 local_b4;
  CodedInputStream *local_b0;
  char local_a5;
  undefined4 local_a4;
  CodedInputStream *local_a0;
  char local_95;
  undefined4 local_94;
  CodedInputStream *local_90;
  char local_85;
  FieldOptions_CType local_84;
  FieldOptions_CType *pFStack_80;
  uint32 temp;
  CodedInputStream *local_78;
  undefined1 local_6d;
  uint32 local_6c;
  bool *pbStack_68;
  uint32 temp_4;
  CodedInputStream *local_60;
  undefined1 local_55;
  uint32 local_54;
  bool *pbStack_50;
  uint32 temp_3;
  CodedInputStream *local_48;
  undefined1 local_3d;
  uint32 local_3c;
  bool *pbStack_38;
  uint32 temp_2;
  CodedInputStream *local_30;
  undefined1 local_25;
  uint32 local_24;
  bool *pbStack_20;
  uint32 temp_1;
  CodedInputStream *local_18;
  undefined1 local_9;
  
  _value = input;
  input_local = (CodedInputStream *)this;
  do {
    while( true ) {
      pCVar1 = _value;
      local_100 = _value;
      if ((_value->buffer_ < _value->buffer_end_) && (*_value->buffer_ < 0x80)) {
        _value->last_tag_ = (uint)*_value->buffer_;
        io::CodedInputStream::Advance(_value,1);
        local_f8 = pCVar1->last_tag_;
      }
      else {
        uVar3 = io::CodedInputStream::ReadTagFallback(_value);
        pCVar1->last_tag_ = uVar3;
        local_f8 = pCVar1->last_tag_;
      }
      local_11c = local_f8;
      if (local_f8 == 0) {
        return true;
      }
      iVar4 = internal::WireFormatLite::GetTagFieldNumber(local_f8);
      if (iVar4 == 1) break;
      if (iVar4 == 2) {
        WVar5 = internal::WireFormatLite::GetTagWireType(local_11c);
        if (WVar5 == WIRETYPE_VARINT) goto LAB_00302606;
      }
      else {
        if (iVar4 == 3) {
          WVar5 = internal::WireFormatLite::GetTagWireType(local_11c);
          if (WVar5 != WIRETYPE_VARINT) goto LAB_00302fe0;
          goto LAB_003027ab;
        }
        if (iVar4 == 5) {
          WVar5 = internal::WireFormatLite::GetTagWireType(local_11c);
          if (WVar5 != WIRETYPE_VARINT) goto LAB_00302fe0;
          goto LAB_00302950;
        }
        if (iVar4 == 9) {
          WVar5 = internal::WireFormatLite::GetTagWireType(local_11c);
          if (WVar5 != WIRETYPE_LENGTH_DELIMITED) goto LAB_00302fe0;
          goto LAB_00302af5;
        }
        if (iVar4 == 10) {
          WVar5 = internal::WireFormatLite::GetTagWireType(local_11c);
          if (WVar5 == WIRETYPE_VARINT) goto LAB_00302caf;
        }
        else if ((iVar4 == 999) &&
                (WVar5 = internal::WireFormatLite::GetTagWireType(local_11c),
                WVar5 == WIRETYPE_LENGTH_DELIMITED)) goto LAB_00302e54;
      }
LAB_00302fe0:
      WVar5 = internal::WireFormatLite::GetTagWireType(local_11c);
      pCVar1 = _value;
      uVar3 = local_11c;
      containing_type = default_instance_;
      if (WVar5 == WIRETYPE_END_GROUP) {
        return true;
      }
      if (local_11c < 8000) {
        pUVar6 = mutable_unknown_fields(this);
        bVar2 = internal::WireFormat::SkipField(pCVar1,uVar3,pUVar6);
        if (!bVar2) {
          return false;
        }
      }
      else {
        pUVar6 = mutable_unknown_fields(this);
        bVar2 = internal::ExtensionSet::ParseField
                          (&this->_extensions_,uVar3,pCVar1,containing_type,pUVar6);
        if (!bVar2) {
          return false;
        }
      }
    }
    WVar5 = internal::WireFormatLite::GetTagWireType(local_11c);
    if (WVar5 != WIRETYPE_VARINT) goto LAB_00302fe0;
    local_78 = _value;
    pFStack_80 = &local_120;
    local_6d = io::CodedInputStream::ReadVarint32(_value,&local_84);
    if (!(bool)local_6d) {
      return false;
    }
    *pFStack_80 = local_84;
    bVar2 = FieldOptions_CType_IsValid(local_120);
    if (bVar2) {
      set_ctype(this,local_120);
    }
    else {
      pUVar6 = mutable_unknown_fields(this);
      UnknownFieldSet::AddVarint(pUVar6,1,(long)(int)local_120);
    }
    local_90 = _value;
    local_94 = 0x10;
    if ((_value->buffer_ < _value->buffer_end_) && (*_value->buffer_ == '\x10')) {
      io::CodedInputStream::Advance(_value,1);
      local_85 = '\x01';
    }
    else {
      local_85 = '\0';
    }
    if (local_85 != '\0') {
LAB_00302606:
      pbStack_20 = &this->packed_;
      local_18 = _value;
      local_9 = io::CodedInputStream::ReadVarint32(_value,&local_24);
      if (!(bool)local_9) {
        return false;
      }
      *pbStack_20 = local_24 != 0;
      set_has_packed(this);
      local_a0 = _value;
      local_a4 = 0x18;
      if ((_value->buffer_ < _value->buffer_end_) && (*_value->buffer_ == '\x18')) {
        io::CodedInputStream::Advance(_value,1);
        local_95 = '\x01';
      }
      else {
        local_95 = '\0';
      }
      if (local_95 != '\0') {
LAB_003027ab:
        pbStack_38 = &this->deprecated_;
        local_30 = _value;
        local_25 = io::CodedInputStream::ReadVarint32(_value,&local_3c);
        if (!(bool)local_25) {
          return false;
        }
        *pbStack_38 = local_3c != 0;
        set_has_deprecated(this);
        local_b0 = _value;
        local_b4 = 0x28;
        if ((_value->buffer_ < _value->buffer_end_) && (*_value->buffer_ == '(')) {
          io::CodedInputStream::Advance(_value,1);
          local_a5 = '\x01';
        }
        else {
          local_a5 = '\0';
        }
        if (local_a5 != '\0') {
LAB_00302950:
          pbStack_50 = &this->lazy_;
          local_48 = _value;
          local_3d = io::CodedInputStream::ReadVarint32(_value,&local_54);
          if (!(bool)local_3d) {
            return false;
          }
          *pbStack_50 = local_54 != 0;
          set_has_lazy(this);
          local_c0 = _value;
          local_c4 = 0x4a;
          if ((_value->buffer_ < _value->buffer_end_) && (*_value->buffer_ == 'J')) {
            io::CodedInputStream::Advance(_value,1);
            local_b5 = '\x01';
          }
          else {
            local_b5 = '\0';
          }
          if (local_b5 != '\0') {
LAB_00302af5:
            pCVar1 = _value;
            value_00 = mutable_experimental_map_key_abi_cxx11_(this);
            bVar2 = internal::WireFormatLite::ReadString(pCVar1,value_00);
            if (!bVar2) {
              return false;
            }
            experimental_map_key_abi_cxx11_(this);
            data = (char *)std::__cxx11::string::data();
            experimental_map_key_abi_cxx11_(this);
            iVar4 = std::__cxx11::string::length();
            internal::WireFormat::VerifyUTF8String(data,iVar4,PARSE);
            local_d0 = _value;
            local_d4 = 0x50;
            if ((_value->buffer_ < _value->buffer_end_) && (*_value->buffer_ == 'P')) {
              io::CodedInputStream::Advance(_value,1);
              local_c5 = '\x01';
            }
            else {
              local_c5 = '\0';
            }
            if (local_c5 != '\0') {
LAB_00302caf:
              pbStack_68 = &this->weak_;
              local_60 = _value;
              local_55 = io::CodedInputStream::ReadVarint32(_value,&local_6c);
              if (!(bool)local_55) {
                return false;
              }
              *pbStack_68 = local_6c != 0;
              set_has_weak(this);
              pCVar1 = _value;
              local_e0 = _value;
              local_e4 = 0x1f3a;
              iVar4 = io::CodedInputStream::BufferSize(_value);
              if (((iVar4 < 2) || ((uint)*pCVar1->buffer_ != (local_e4 & 0xff | 0x80))) ||
                 ((uint)pCVar1->buffer_[1] != (local_e4 >> 7 & 0xff))) {
                local_d5 = '\0';
              }
              else {
                io::CodedInputStream::Advance(pCVar1,2);
                local_d5 = '\x01';
              }
              if (local_d5 != '\0') {
LAB_00302e54:
                do {
                  pCVar1 = _value;
                  value_01 = add_uninterpreted_option(this);
                  bVar2 = internal::WireFormatLite::
                          ReadMessageNoVirtual<google::protobuf::UninterpretedOption>
                                    (pCVar1,value_01);
                  pCVar1 = _value;
                  if (!bVar2) {
                    return false;
                  }
                  local_f0 = _value;
                  local_f4 = 0x1f3a;
                  iVar4 = io::CodedInputStream::BufferSize(_value);
                  if (((iVar4 < 2) || ((uint)*pCVar1->buffer_ != (local_f4 & 0xff | 0x80))) ||
                     ((uint)pCVar1->buffer_[1] != (local_f4 >> 7 & 0xff))) {
                    local_e5 = '\0';
                  }
                  else {
                    io::CodedInputStream::Advance(pCVar1,2);
                    local_e5 = '\x01';
                  }
                } while (local_e5 != '\0');
                bVar2 = io::CodedInputStream::ExpectAtEnd(_value);
                if (bVar2) {
                  return true;
                }
              }
            }
          }
        }
      }
    }
  } while( true );
}

Assistant:

bool FieldOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FieldOptions_CType_IsValid(value)) {
            set_ctype(static_cast< ::google::protobuf::FieldOptions_CType >(value));
          } else {
            mutable_unknown_fields()->AddVarint(1, value);
          }
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(16)) goto parse_packed;
        break;
      }

      // optional bool packed = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_packed:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &packed_)));
          set_has_packed();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(24)) goto parse_deprecated;
        break;
      }

      // optional bool deprecated = 3 [default = false];
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_deprecated:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &deprecated_)));
          set_has_deprecated();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(40)) goto parse_lazy;
        break;
      }

      // optional bool lazy = 5 [default = false];
      case 5: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_lazy:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &lazy_)));
          set_has_lazy();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(74)) goto parse_experimental_map_key;
        break;
      }

      // optional string experimental_map_key = 9;
      case 9: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_experimental_map_key:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_experimental_map_key()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->experimental_map_key().data(), this->experimental_map_key().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(80)) goto parse_weak;
        break;
      }

      // optional bool weak = 10 [default = false];
      case 10: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_weak:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &weak_)));
          set_has_weak();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_uninterpreted_option:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, default_instance_,
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}